

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall clickhouse::Client::Impl::ExecuteQuery(Impl *this,Query *query)

{
  bool bVar1;
  function<void_()> *in_RSI;
  long in_RDI;
  EnsureNull en;
  uint64_t *in_stack_000000f0;
  Impl *in_stack_000000f8;
  string *in_stack_00000118;
  Impl *in_stack_00000120;
  Query *in_stack_ffffffffffffff68;
  string local_70 [8];
  function<void_()> *in_stack_ffffffffffffff98;
  Impl *in_stack_ffffffffffffffa0;
  anon_class_8_1_8991fb9c local_38 [4];
  EnsureNull local_18 [3];
  
  EnsureNull::EnsureNull(local_18,(QueryEvents *)in_RSI,(QueryEvents **)(in_RDI + 200));
  if ((*(byte *)(in_RDI + 0x89) & 1) != 0) {
    std::function<void()>::
    function<clickhouse::Client::Impl::ExecuteQuery(clickhouse::Query)::__0,void>(in_RSI,local_38);
    RetryGuard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::function<void_()>::~function((function<void_()> *)0x24c0c4);
  }
  Query::GetText_abi_cxx11_(in_stack_ffffffffffffff68);
  SendQuery(in_stack_00000120,in_stack_00000118);
  std::__cxx11::string::~string(local_70);
  do {
    bVar1 = ReceivePacket(in_stack_000000f8,in_stack_000000f0);
  } while (bVar1);
  EnsureNull::~EnsureNull(local_18);
  return;
}

Assistant:

void Client::Impl::ExecuteQuery(Query query) {
    EnsureNull en(static_cast<QueryEvents*>(&query), &events_);

    if (options_.ping_before_query) {
        RetryGuard([this]() { Ping(); });
    }

    SendQuery(query.GetText());

    while (ReceivePacket()) {
        ;
    }
}